

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::detail::MultipartFormDataParser::parse
          (MultipartFormDataParser *this,char *buf,size_t n,ContentReceiver *content_callback,
          MultipartContentHeader *header_callback)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  long *plVar7;
  char *pcVar8;
  size_type *psVar9;
  long lVar10;
  _Alloc_hider _Var11;
  string *psVar12;
  byte bVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> pattern;
  smatch m;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  char *local_a8;
  long local_a0;
  char local_98;
  undefined7 uStack_97;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Any_data *local_60;
  string *local_58;
  MultipartFormData *local_50;
  _Any_data *local_48;
  string *local_40;
  string *local_38;
  
  local_60 = (_Any_data *)content_callback;
  if ((parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
       ::re_content_disposition_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                   ::re_content_disposition_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                ::re_content_disposition_abi_cxx11_,
               "^Content-Disposition:\\s*form-data;\\s*name=\"(.*?)\"(?:;\\s*filename=\"(.*?)\")?(?:;\\s*filename\\*=\\S+)?\\s*$"
               ,1);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                  ::re_content_disposition_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                         ::re_content_disposition_abi_cxx11_);
  }
  if ((parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
       ::dash__abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                   ::dash__abi_cxx11_), iVar4 != 0)) {
    parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
    ::dash__abi_cxx11_._M_dataplus._M_p =
         (pointer)&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                   ::dash__abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                ::dash__abi_cxx11_,"--","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                  ::dash__abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                         ::dash__abi_cxx11_);
  }
  if ((parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
       ::crlf__abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                   ::crlf__abi_cxx11_), iVar4 != 0)) {
    parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
    ::crlf__abi_cxx11_._M_dataplus._M_p =
         (pointer)&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                   ::crlf__abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                ::crlf__abi_cxx11_,"\r\n","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                  ::crlf__abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                         ::crlf__abi_cxx11_);
  }
  buf_append(this,buf,n);
  uVar5 = this->buf_epos_ - this->buf_spos_;
  if (uVar5 != 0) {
    psVar12 = &this->buf_;
    local_50 = &this->file_;
    local_40 = (string *)&(this->file_).filename;
    local_38 = (string *)&(this->file_).content_type;
    local_58 = psVar12;
    local_48 = (_Any_data *)header_callback;
    do {
      switch(this->state_) {
      case 0:
        std::operator+(&local_88,
                       &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                        ::dash__abi_cxx11_,&this->boundary_);
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_88,
                                    (ulong)parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                           ::crlf__abi_cxx11_._M_dataplus._M_p);
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_c8.field_2._M_allocated_capacity = *psVar9;
          local_c8.field_2._8_8_ = plVar7[3];
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        }
        else {
          local_c8.field_2._M_allocated_capacity = *psVar9;
          local_c8._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_c8._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        bVar2 = true;
        if ((char *)(this->buf_epos_ - this->buf_spos_) < local_c8._M_string_length) {
          buf = (char *)0x1;
        }
        else {
          bVar3 = buf_start_with(this,&local_c8);
          if (bVar3) {
            this->buf_spos_ = (size_t)(local_c8._M_string_length + this->buf_spos_);
            this->state_ = 1;
            bVar2 = false;
          }
          else {
            buf = (char *)0x0;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00148866;
      case 1:
        (this->file_).name._M_string_length = 0;
        *(this->file_).name._M_dataplus._M_p = '\0';
        (this->file_).filename._M_string_length = 0;
        *(this->file_).filename._M_dataplus._M_p = '\0';
        (this->file_).content_type._M_string_length = 0;
        *(this->file_).content_type._M_dataplus._M_p = '\0';
        sVar6 = 2;
        goto LAB_001484f4;
      case 2:
        sVar6 = buf_find(this,&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                               ::crlf__abi_cxx11_);
        bVar2 = true;
        if (sVar6 < 0x2001) {
          while (sVar6 < this->buf_epos_ - this->buf_spos_) {
            if (sVar6 == 0) {
              if (*(long *)(local_48 + 1) == 0) {
                std::__throw_bad_function_call();
              }
              bVar2 = (**(code **)(local_48->_M_pod_data + 0x18))(local_48,local_50);
              if (!bVar2) {
                this->is_valid_ = false;
                buf = (char *)0x0;
                bVar2 = true;
                goto LAB_00148866;
              }
              this->buf_spos_ =
                   this->buf_spos_ +
                   parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                   ::crlf__abi_cxx11_._M_string_length;
              this->state_ = 3;
              break;
            }
            if ((parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                 ::header_name_abi_cxx11_ == '\0') &&
               (iVar4 = __cxa_guard_acquire(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                             ::header_name_abi_cxx11_), iVar4 != 0)) {
              parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
              ::header_name_abi_cxx11_._M_dataplus._M_p =
                   (pointer)&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                             ::header_name_abi_cxx11_.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)
                         &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                          ::header_name_abi_cxx11_,"content-type:","");
              __cxa_atexit(std::__cxx11::string::~string,
                           &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                            ::header_name_abi_cxx11_,&__dso_handle);
              __cxa_guard_release(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                   ::header_name_abi_cxx11_);
              psVar12 = local_58;
            }
            std::__cxx11::string::substr((ulong)&local_c8,(ulong)psVar12);
            bVar2 = start_with_case_ignore
                              (this,&local_c8,
                               &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                ::header_name_abi_cxx11_);
            if (bVar2) {
              std::__cxx11::string::substr((ulong)&local_a8,(ulong)&local_c8);
              lVar10 = 0;
              lVar1 = local_a0;
              if (0 < local_a0) {
                do {
                  if ((local_a8[lVar10] != ' ') && (local_a8[lVar10] != '\t')) break;
                  lVar10 = lVar10 + 1;
                } while (local_a0 != lVar10);
              }
              for (; (lVar1 != 0 &&
                     ((local_a8[lVar1 + -1] == ' ' || (local_a8[lVar1 + -1] == '\t'))));
                  lVar1 = lVar1 + -1) {
              }
              std::__cxx11::string::substr((ulong)&local_88,(ulong)&local_a8);
              std::__cxx11::string::operator=(local_38,(string *)&local_88);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_a8 != &local_98) {
                uVar5 = CONCAT71(uStack_97,local_98) + 1;
                _Var11._M_p = local_a8;
LAB_001483d9:
                operator_delete(_Var11._M_p,uVar5);
              }
            }
            else {
              local_88.field_2._M_allocated_capacity = 0;
              local_88.field_2._8_8_ = 0;
              local_88._M_dataplus._M_p = (char *)0x0;
              local_88._M_string_length = 0;
              bVar2 = std::__detail::
                      __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )local_c8._M_dataplus._M_p,
                                 (char *)(local_c8._M_string_length +
                                         (long)local_c8._M_dataplus._M_p),
                                 (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  *)&local_88,
                                 &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                  ::re_content_disposition_abi_cxx11_,0);
              if (bVar2) {
                if (local_88._M_dataplus._M_p == (pointer)local_88._M_string_length) {
                  bVar2 = false;
                }
                else {
                  bVar2 = ((long)(local_88._M_string_length - (long)local_88._M_dataplus._M_p) >> 3)
                          * -0x5555555555555555 - 5U < 0xfffffffffffffffe;
                }
                pcVar8 = (char *)(local_88._M_string_length + -0x48);
                if (bVar2) {
                  pcVar8 = local_88._M_dataplus._M_p + 0x18;
                }
                local_a8 = &local_98;
                if (pcVar8[0x10] == '\x01') {
                  std::__cxx11::string::
                  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                            ((string *)&local_a8,*(undefined8 *)pcVar8,*(undefined8 *)(pcVar8 + 8));
                }
                else {
                  local_a0 = 0;
                  local_98 = '\0';
                }
                std::__cxx11::string::operator=((string *)local_50,(string *)&local_a8);
                if (local_a8 != &local_98) {
                  operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
                }
                if (local_88._M_dataplus._M_p == (pointer)local_88._M_string_length) {
                  bVar2 = false;
                }
                else {
                  bVar2 = ((long)(local_88._M_string_length - (long)local_88._M_dataplus._M_p) >> 3)
                          * -0x5555555555555555 - 6U < 0xfffffffffffffffd;
                }
                pcVar8 = (char *)(local_88._M_string_length + -0x48);
                if (bVar2) {
                  pcVar8 = local_88._M_dataplus._M_p + 0x30;
                }
                local_a8 = &local_98;
                if (pcVar8[0x10] == '\x01') {
                  std::__cxx11::string::
                  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                            ((string *)&local_a8,*(undefined8 *)pcVar8,*(undefined8 *)(pcVar8 + 8));
                }
                else {
                  local_a0 = 0;
                  local_98 = '\0';
                }
                std::__cxx11::string::operator=(local_40,(string *)&local_a8);
                psVar12 = local_58;
                if (local_a8 != &local_98) {
                  operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
                  psVar12 = local_58;
                }
              }
              if (local_88._M_dataplus._M_p != (char *)0x0) {
                uVar5 = local_88.field_2._M_allocated_capacity - (long)local_88._M_dataplus._M_p;
                _Var11._M_p = local_88._M_dataplus._M_p;
                goto LAB_001483d9;
              }
            }
            this->buf_spos_ =
                 this->buf_spos_ +
                 sVar6 + parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                         ::crlf__abi_cxx11_._M_string_length;
            sVar6 = buf_find(this,&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                   ::crlf__abi_cxx11_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
          }
          bVar2 = this->state_ != 3;
          buf = (char *)(ulong)(byte)((byte)buf | bVar2);
        }
        else {
          buf = (char *)0x0;
        }
LAB_00148866:
        bVar13 = (byte)buf;
        if (bVar2) goto LAB_00147fd7;
        break;
      case 3:
        std::operator+(&local_c8,
                       &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                        ::crlf__abi_cxx11_,
                       &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                        ::dash__abi_cxx11_);
        if ((char *)(this->buf_epos_ - this->buf_spos_) < local_c8._M_string_length) {
          buf = (char *)0x1;
          bVar2 = false;
        }
        else {
          pcVar8 = (char *)buf_find(this,&local_c8);
          local_88._M_dataplus._M_p = (this->buf_)._M_dataplus._M_p + this->buf_spos_;
          local_a8 = pcVar8;
          if (*(long *)(local_60 + 1) == 0) {
            std::__throw_bad_function_call();
          }
          bVar2 = (**(code **)(local_60->_M_pod_data + 0x18))
                            (local_60,(char **)&local_88,(unsigned_long *)&local_a8);
          if (bVar2) {
            this->buf_spos_ = (size_t)(pcVar8 + this->buf_spos_);
            bVar2 = true;
          }
          else {
            this->is_valid_ = false;
            bVar2 = false;
            buf = (char *)0x0;
          }
        }
        bVar13 = (byte)buf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if (!bVar2) goto LAB_00147fd7;
        std::operator+(&local_88,
                       &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                        ::crlf__abi_cxx11_,
                       &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                        ::dash__abi_cxx11_);
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_88,(ulong)(this->boundary_)._M_dataplus._M_p);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_c8.field_2._M_allocated_capacity = *psVar9;
          local_c8.field_2._8_8_ = plVar7[3];
        }
        else {
          local_c8.field_2._M_allocated_capacity = *psVar9;
          local_c8._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_c8._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if ((char *)(this->buf_epos_ - this->buf_spos_) < local_c8._M_string_length) {
          buf = (char *)0x1;
          bVar2 = false;
        }
        else {
          pcVar8 = (char *)buf_find(this,&local_c8);
          sVar6 = this->buf_spos_;
          if (pcVar8 < (char *)(this->buf_epos_ - sVar6)) {
            local_88._M_dataplus._M_p = (this->buf_)._M_dataplus._M_p + sVar6;
            local_a8 = pcVar8;
            if (*(long *)(local_60 + 1) == 0) {
LAB_001489cd:
              std::__throw_bad_function_call();
            }
            bVar2 = (**(code **)(local_60->_M_pod_data + 0x18))
                              (local_60,(char **)&local_88,(unsigned_long *)&local_a8);
            if (!bVar2) {
LAB_001487f1:
              this->is_valid_ = false;
              bVar2 = false;
              buf = (char *)0x0;
              goto LAB_001487fb;
            }
            this->buf_spos_ = (size_t)(pcVar8 + local_c8._M_string_length + this->buf_spos_);
            this->state_ = 4;
          }
          else {
            local_88._M_dataplus._M_p = (this->buf_)._M_dataplus._M_p + sVar6;
            local_a8 = (char *)local_c8._M_string_length;
            if (*(long *)(local_60 + 1) == 0) goto LAB_001489cd;
            bVar2 = (**(code **)(local_60->_M_pod_data + 0x18))
                              (local_60,(char **)&local_88,(unsigned_long *)&local_a8);
            if (!bVar2) goto LAB_001487f1;
            this->buf_spos_ = (size_t)(local_c8._M_string_length + this->buf_spos_);
          }
LAB_001487ed:
          bVar2 = true;
        }
LAB_001487fb:
        bVar13 = (byte)buf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if (!bVar2) goto LAB_00147fd7;
        break;
      case 4:
        if (uVar5 < parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                    ::crlf__abi_cxx11_._M_string_length) goto LAB_00147fd4;
        bVar2 = buf_start_with(this,&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                     ::crlf__abi_cxx11_);
        if (!bVar2) {
          std::operator+(&local_c8,
                         &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                          ::dash__abi_cxx11_,
                         &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                          ::crlf__abi_cxx11_);
          if ((local_c8._M_string_length <= (char *)(this->buf_epos_ - this->buf_spos_)) &&
             (bVar2 = buf_start_with(this,&local_c8), bVar2)) {
            this->buf_spos_ = (size_t)(local_c8._M_string_length + this->buf_spos_);
            this->is_valid_ = true;
            this->state_ = 5;
            goto LAB_001487ed;
          }
          bVar2 = false;
          buf = (char *)0x1;
          goto LAB_001487fb;
        }
        this->buf_spos_ =
             this->buf_spos_ +
             parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
             ::crlf__abi_cxx11_._M_string_length;
        sVar6 = 1;
LAB_001484f4:
        this->state_ = sVar6;
        break;
      case 5:
        this->is_valid_ = false;
        bVar13 = 0;
        goto LAB_00147fd7;
      }
      uVar5 = this->buf_epos_ - this->buf_spos_;
    } while (uVar5 != 0);
  }
LAB_00147fd4:
  bVar13 = 1;
LAB_00147fd7:
  return (bool)(bVar13 & 1);
}

Assistant:

bool parse(const char *buf, size_t n, const ContentReceiver &content_callback,
             const MultipartContentHeader &header_callback) {

    // TODO: support 'filename*'
    static const std::regex re_content_disposition(
        R"~(^Content-Disposition:\s*form-data;\s*name="(.*?)"(?:;\s*filename="(.*?)")?(?:;\s*filename\*=\S+)?\s*$)~",
        std::regex_constants::icase);

    static const std::string dash_ = "--";
    static const std::string crlf_ = "\r\n";

    buf_append(buf, n);

    while (buf_size() > 0) {
      switch (state_) {
      case 0: { // Initial boundary
        auto pattern = dash_ + boundary_ + crlf_;
        if (pattern.size() > buf_size()) { return true; }
        if (!buf_start_with(pattern)) { return false; }
        buf_erase(pattern.size());
        state_ = 1;
        break;
      }
      case 1: { // New entry
        clear_file_info();
        state_ = 2;
        break;
      }
      case 2: { // Headers
        auto pos = buf_find(crlf_);
        if (pos > CPPHTTPLIB_HEADER_MAX_LENGTH) { return false; }
        while (pos < buf_size()) {
          // Empty line
          if (pos == 0) {
            if (!header_callback(file_)) {
              is_valid_ = false;
              return false;
            }
            buf_erase(crlf_.size());
            state_ = 3;
            break;
          }

          static const std::string header_name = "content-type:";
          const auto header = buf_head(pos);
          if (start_with_case_ignore(header, header_name)) {
            file_.content_type = trim_copy(header.substr(header_name.size()));
          } else {
            std::smatch m;
            if (std::regex_match(header, m, re_content_disposition)) {
              file_.name = m[1];
              file_.filename = m[2];
            }
          }

          buf_erase(pos + crlf_.size());
          pos = buf_find(crlf_);
        }
        if (state_ != 3) { return true; }
        break;
      }
      case 3: { // Body
        {
          auto pattern = crlf_ + dash_;
          if (pattern.size() > buf_size()) { return true; }

          auto pos = buf_find(pattern);

          if (!content_callback(buf_data(), pos)) {
            is_valid_ = false;
            return false;
          }

          buf_erase(pos);
        }
        {
          auto pattern = crlf_ + dash_ + boundary_;
          if (pattern.size() > buf_size()) { return true; }

          auto pos = buf_find(pattern);
          if (pos < buf_size()) {
            if (!content_callback(buf_data(), pos)) {
              is_valid_ = false;
              return false;
            }

            buf_erase(pos + pattern.size());
            state_ = 4;
          } else {
            if (!content_callback(buf_data(), pattern.size())) {
              is_valid_ = false;
              return false;
            }

            buf_erase(pattern.size());
          }
        }
        break;
      }
      case 4: { // Boundary
        if (crlf_.size() > buf_size()) { return true; }
        if (buf_start_with(crlf_)) {
          buf_erase(crlf_.size());
          state_ = 1;
        } else {
          auto pattern = dash_ + crlf_;
          if (pattern.size() > buf_size()) { return true; }
          if (buf_start_with(pattern)) {
            buf_erase(pattern.size());
            is_valid_ = true;
            state_ = 5;
          } else {
            return true;
          }
        }
        break;
      }
      case 5: { // Done
        is_valid_ = false;
        return false;
      }
      }
    }

    return true;
  }